

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O3

int plus_or_minus_proc(Am_Object *self)

{
  long lVar1;
  short *psVar2;
  undefined8 uVar3;
  Am_Object inter;
  Am_Object local_10;
  
  Am_Object::Get_Object((ushort)&local_10,(ulong)self);
  psVar2 = (short *)Am_Object::Get((ushort)&local_10,0x11b);
  lVar1 = *(long *)(psVar2 + 4);
  if ((lVar1 != 0) && (*psVar2 != (short)Am_Input_Char::Am_Input_Char_ID)) {
    uVar3 = Am_Error();
    Am_Object::~Am_Object(&local_10);
    _Unwind_Resume(uVar3);
  }
  Am_Object::~Am_Object(&local_10);
  return (uint)(((uint)lVar1 & 0xffff) != 0x100) * 0x10 + -8;
}

Assistant:

Am_Define_Formula(int, plus_or_minus)
{
  Am_Object inter = self.Get_Owner();
  //  Am_Input_Char ic = Am_Input_Char::Narrow(inter.GV(Am_START_CHAR));
  Am_Input_Char ic = inter.Get(Am_START_CHAR);
  if (ic.code == Am_LEFT_MOUSE)
    return -8;
  return 8;
}